

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O0

Error asmjit::v1_14::x86::InstInternal::queryFeatures
                (Arch arch,BaseInst *inst,Operand_ *operands,size_t opCount,CpuFeatures *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  Array<unsigned_long,_4UL> *pAVar7;
  Error EVar8;
  uint32_t uVar9;
  byte *pbVar10;
  unsigned_long *puVar11;
  ulong uVar12;
  sbyte sVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  size_t in_RCX;
  Operand_ *in_RDX;
  uint *in_RSI;
  char in_DIL;
  Array<unsigned_long,_4UL> *in_R8;
  bool bVar20;
  uint32_t useEvex;
  bool isAVX2;
  RegAnalysis regAnalysis;
  uint32_t feature;
  uint8_t *fEnd;
  uint8_t *fData;
  AdditionalInfo *additionalInfo;
  InstInfo *instInfo;
  InstOptions options;
  InstId instId;
  uint *in_stack_ffffffffffffef48;
  Array<unsigned_long,_4UL> *in_stack_ffffffffffffef50;
  byte local_fda;
  byte local_fd9;
  byte local_fd8;
  bool local_fd7;
  bool local_fd6;
  bool local_fd5;
  undefined1 local_e77;
  byte local_e76 [14];
  uint local_e68;
  byte local_e62 [16];
  bool local_e52;
  undefined1 local_e51;
  undefined1 local_e50;
  byte local_e4f [19];
  RegAnalysis local_e3c;
  uint local_e34;
  byte *local_e30;
  byte *local_e28;
  AdditionalInfo *local_e20;
  InstInfo *local_e18;
  InstOptions local_e10;
  uint local_e0c;
  Array<unsigned_long,_4UL> *local_e08;
  size_t local_e00;
  Operand_ *local_df8;
  uint *local_df0;
  undefined1 local_de5 [5];
  uint local_de0;
  Operand_ *local_dd0;
  Operand_ *local_dc8;
  Operand_ *local_dc0;
  Operand_ *local_db8;
  Operand_ *local_db0;
  Operand_ *local_da8;
  Operand_ *local_da0;
  Operand_ *local_d98;
  Operand_ *local_d90;
  Operand_ *local_d88;
  Operand_ *local_d80;
  Operand_ *local_d78;
  undefined4 local_d6c;
  undefined4 local_d68;
  undefined4 local_d64;
  uint local_d60;
  uint local_d5c;
  Operand_ *local_d58;
  undefined1 *local_d50;
  Array<unsigned_long,_4UL> *local_d40;
  uint *local_d38;
  Array<unsigned_long,_4UL> *local_d30;
  undefined1 *local_d28;
  Array<unsigned_long,_4UL> *local_d20;
  undefined1 *local_d18;
  Array<unsigned_long,_4UL> *local_d10;
  byte *local_d08;
  Array<unsigned_long,_4UL> *local_d00;
  byte *local_cf8;
  Array<unsigned_long,_4UL> *local_cf0;
  byte *local_ce8;
  Array<unsigned_long,_4UL> *local_ce0;
  byte *local_cd8;
  Array<unsigned_long,_4UL> *local_cd0;
  byte *local_cc8;
  char *in_stack_fffffffffffff340;
  undefined8 in_stack_fffffffffffff348;
  char *in_stack_fffffffffffff350;
  undefined1 local_bc1;
  byte *local_bc0;
  byte *local_bb8;
  byte *local_bb0;
  byte *local_ba8;
  byte *local_ba0;
  byte *local_b98;
  byte *local_b90;
  byte *local_b88;
  Array<unsigned_long,_4UL> *local_b80;
  byte *local_b78;
  byte *local_b70;
  byte *local_b68;
  byte *local_b60;
  byte *local_b58;
  byte *local_b50;
  Array<unsigned_long,_4UL> *local_b48;
  uint *local_b40;
  Operand_ *local_b38;
  Operand_ *local_b30;
  InstInfo *local_b28;
  uint *local_b20;
  undefined4 local_b18;
  undefined4 local_b14;
  byte *local_b10;
  byte *local_b08;
  byte *local_b00;
  byte *local_af8;
  byte *local_af0;
  byte *local_ae8;
  byte *local_ae0;
  Array<unsigned_long,_4UL> *local_ad8;
  byte *local_ad0;
  byte *local_ac8;
  byte *local_ac0;
  byte *local_ab8;
  byte *local_ab0;
  byte *local_aa8;
  byte *local_aa0;
  Array<unsigned_long,_4UL> *local_a98;
  undefined4 local_a8c;
  uint *local_a88;
  undefined4 *local_a80;
  uint *local_a78;
  Operand_ *local_a70;
  Operand_ *local_a68;
  Operand_ *local_a60;
  Operand_ *local_a58;
  Operand_ *local_a50;
  Operand_ *local_a48;
  Operand_ *local_a40;
  Operand_ *local_a38;
  Operand_ *local_a30;
  Operand_ *local_a28;
  Operand_ *local_a20;
  Operand_ *local_a18;
  undefined4 local_a0c;
  uint *local_a08;
  uint local_9fc;
  undefined1 local_9f5;
  undefined4 local_9f4;
  Operand_ *local_9f0;
  uint local_9e4;
  undefined4 local_9e0;
  undefined4 local_9dc;
  undefined4 *local_9d8;
  undefined4 *local_9d0;
  undefined4 local_9c4;
  unsigned_long local_9c0;
  Array<unsigned_long,_4UL> *local_9b8;
  undefined1 *local_9b0;
  byte *local_9a8;
  byte *local_9a0;
  undefined1 *local_998;
  Operand_ *local_990;
  uint local_988 [2];
  Operand_ *local_980;
  Operand_ *local_978;
  uint local_970;
  undefined4 local_96c;
  uint *local_968;
  undefined4 local_95c;
  Operand_ *local_958;
  uint local_94c;
  uint local_948;
  uint local_944;
  uint *local_940;
  Array<unsigned_long,_4UL> *local_938;
  undefined4 local_930;
  undefined4 local_92c;
  byte *local_928;
  Array<unsigned_long,_4UL> *local_920;
  undefined4 local_918;
  undefined4 local_914;
  byte *local_910;
  Array<unsigned_long,_4UL> *local_908;
  undefined4 local_900;
  undefined4 local_8fc;
  byte *local_8f8;
  Array<unsigned_long,_4UL> *local_8f0;
  undefined4 local_8e8;
  undefined4 local_8e4;
  byte *local_8e0;
  Array<unsigned_long,_4UL> *local_8d8;
  undefined4 local_8d0;
  undefined4 local_8cc;
  byte *local_8c8;
  Array<unsigned_long,_4UL> *local_8c0;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined1 *local_8b0;
  Array<unsigned_long,_4UL> *local_8a8;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined1 *local_898;
  Array<unsigned_long,_4UL> *local_890;
  undefined4 local_888;
  undefined4 local_884;
  byte *local_880;
  Array<unsigned_long,_4UL> *local_878;
  undefined4 local_870;
  undefined4 local_86c;
  byte *local_868;
  Array<unsigned_long,_4UL> *local_860;
  undefined4 local_858;
  undefined4 local_854;
  byte *local_850;
  Array<unsigned_long,_4UL> *local_848;
  undefined4 local_840;
  undefined4 local_83c;
  byte *local_838;
  Array<unsigned_long,_4UL> *local_830;
  undefined4 local_828;
  undefined4 local_824;
  byte *local_820;
  Array<unsigned_long,_4UL> *local_818;
  undefined4 local_810;
  undefined4 local_80c;
  byte *local_808;
  Array<unsigned_long,_4UL> *local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  byte *local_7f0;
  Array<unsigned_long,_4UL> *local_7e8;
  undefined4 local_7e0;
  undefined4 local_7dc;
  byte *local_7d8;
  Array<unsigned_long,_4UL> *local_7d0;
  undefined4 local_7c8;
  undefined4 local_7c4;
  byte *local_7c0;
  Array<unsigned_long,_4UL> *local_7b8;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined1 *local_7a8;
  Array<unsigned_long,_4UL> *local_7a0;
  byte *local_798;
  byte *local_790;
  Array<unsigned_long,_4UL> *local_788;
  uint local_780;
  uint local_77c;
  byte *local_778;
  Array<unsigned_long,_4UL> *local_770;
  undefined4 local_768;
  undefined4 local_764;
  byte *local_760;
  Array<unsigned_long,_4UL> *local_758;
  byte *local_750;
  byte *local_748;
  Array<unsigned_long,_4UL> *local_740;
  uint local_738;
  uint local_734;
  byte *local_730;
  Array<unsigned_long,_4UL> *local_728;
  undefined4 local_720;
  undefined4 local_71c;
  byte *local_718;
  Array<unsigned_long,_4UL> *local_710;
  byte *local_708;
  byte *local_700;
  byte *local_6f8;
  Array<unsigned_long,_4UL> *local_6f0;
  undefined4 local_6e8;
  undefined4 local_6e4;
  byte *local_6e0;
  Array<unsigned_long,_4UL> *local_6d8;
  byte *local_6d0;
  byte *local_6c8;
  Array<unsigned_long,_4UL> *local_6c0;
  uint local_6b8;
  uint local_6b4;
  byte *local_6b0;
  Array<unsigned_long,_4UL> *local_6a8;
  uint local_6a0;
  uint local_69c;
  byte *local_698;
  Array<unsigned_long,_4UL> *local_690;
  byte *local_688;
  byte *local_680;
  byte *local_678;
  byte *local_670;
  byte *local_668;
  byte *local_660;
  byte *local_658;
  Array<unsigned_long,_4UL> *local_650;
  undefined4 local_648;
  undefined4 local_644;
  byte *local_640;
  Array<unsigned_long,_4UL> *local_638;
  byte *local_630;
  byte *local_628;
  byte *local_620;
  byte *local_618;
  byte *local_610;
  byte *local_608;
  Array<unsigned_long,_4UL> *local_600;
  uint local_5f8;
  uint local_5f4;
  byte *local_5f0;
  Array<unsigned_long,_4UL> *local_5e8;
  byte *local_5e0;
  byte *local_5d8;
  byte *local_5d0;
  byte *local_5c8;
  byte *local_5c0;
  byte *local_5b8;
  Array<unsigned_long,_4UL> *local_5b0;
  undefined4 local_5a8;
  undefined4 local_5a4;
  byte *local_5a0;
  Array<unsigned_long,_4UL> *local_598;
  byte *local_590;
  byte *local_588;
  byte *local_580;
  byte *local_578;
  byte *local_570;
  Array<unsigned_long,_4UL> *local_568;
  uint local_560;
  uint local_55c;
  byte *local_558;
  Array<unsigned_long,_4UL> *local_550;
  byte *local_548;
  byte *local_540;
  byte *local_538;
  byte *local_530;
  byte *local_528;
  Array<unsigned_long,_4UL> *local_520;
  uint local_518;
  uint local_514;
  byte *local_510;
  Array<unsigned_long,_4UL> *local_508;
  byte *local_500;
  byte *local_4f8;
  byte *local_4f0;
  byte *local_4e8;
  Array<unsigned_long,_4UL> *local_4e0;
  uint local_4d8;
  uint local_4d4;
  byte *local_4d0;
  Array<unsigned_long,_4UL> *local_4c8;
  byte *local_4c0;
  byte *local_4b8;
  byte *local_4b0;
  byte *local_4a8;
  Array<unsigned_long,_4UL> *local_4a0;
  uint local_498;
  uint local_494;
  byte *local_490;
  Array<unsigned_long,_4UL> *local_488;
  byte *local_480;
  byte *local_478;
  byte *local_470;
  Array<unsigned_long,_4UL> *local_468;
  uint local_460;
  uint local_45c;
  byte *local_458;
  Array<unsigned_long,_4UL> *local_450;
  byte *local_448;
  byte *local_440;
  byte *local_438;
  Array<unsigned_long,_4UL> *local_430;
  uint local_428;
  uint local_424;
  byte *local_420;
  Array<unsigned_long,_4UL> *local_418;
  byte *local_410;
  byte *local_408;
  Array<unsigned_long,_4UL> *local_400;
  uint local_3f8;
  uint local_3f4;
  byte *local_3f0;
  Array<unsigned_long,_4UL> *local_3e8;
  byte *local_3e0;
  byte *local_3d8;
  Array<unsigned_long,_4UL> *local_3d0;
  uint local_3c8;
  uint local_3c4;
  byte *local_3c0;
  Array<unsigned_long,_4UL> *local_3b8;
  byte *local_3b0;
  Array<unsigned_long,_4UL> *local_3a8;
  uint local_3a0;
  uint local_39c;
  byte *local_398;
  Array<unsigned_long,_4UL> *local_390;
  byte *local_388;
  Array<unsigned_long,_4UL> *local_380;
  uint local_378;
  uint local_374;
  byte *local_370;
  Array<unsigned_long,_4UL> *local_368;
  byte *local_360;
  byte *local_358;
  byte *local_350;
  byte *local_348;
  byte *local_340;
  byte *local_338;
  byte *local_330;
  Array<unsigned_long,_4UL> *local_328;
  undefined4 local_320;
  undefined4 local_31c;
  byte *local_318;
  Array<unsigned_long,_4UL> *local_310;
  byte *local_308;
  byte *local_300;
  byte *local_2f8;
  byte *local_2f0;
  byte *local_2e8;
  byte *local_2e0;
  byte *local_2d8;
  Array<unsigned_long,_4UL> *local_2d0;
  undefined4 local_2c8;
  undefined4 local_2c4;
  byte *local_2c0;
  Array<unsigned_long,_4UL> *local_2b8;
  byte *local_2b0;
  byte *local_2a8;
  byte *local_2a0;
  byte *local_298;
  byte *local_290;
  byte *local_288;
  Array<unsigned_long,_4UL> *local_280;
  uint local_278;
  uint local_274;
  byte *local_270;
  Array<unsigned_long,_4UL> *local_268;
  byte *local_260;
  byte *local_258;
  byte *local_250;
  byte *local_248;
  byte *local_240;
  byte *local_238;
  Array<unsigned_long,_4UL> *local_230;
  uint local_228;
  uint local_224;
  byte *local_220;
  Array<unsigned_long,_4UL> *local_218;
  byte *local_210;
  byte *local_208;
  byte *local_200;
  byte *local_1f8;
  byte *local_1f0;
  Array<unsigned_long,_4UL> *local_1e8;
  uint local_1e0;
  uint local_1dc;
  byte *local_1d8;
  Array<unsigned_long,_4UL> *local_1d0;
  byte *local_1c8;
  byte *local_1c0;
  byte *local_1b8;
  byte *local_1b0;
  byte *local_1a8;
  Array<unsigned_long,_4UL> *local_1a0;
  uint local_198;
  uint local_194;
  byte *local_190;
  Array<unsigned_long,_4UL> *local_188;
  byte *local_180;
  byte *local_178;
  byte *local_170;
  byte *local_168;
  Array<unsigned_long,_4UL> *local_160;
  uint local_158;
  uint local_154;
  byte *local_150;
  Array<unsigned_long,_4UL> *local_148;
  byte *local_140;
  byte *local_138;
  byte *local_130;
  Array<unsigned_long,_4UL> *local_128;
  uint local_120;
  uint local_11c;
  byte *local_118;
  Array<unsigned_long,_4UL> *local_110;
  byte *local_108;
  byte *local_100;
  Array<unsigned_long,_4UL> *local_f8;
  uint local_f0;
  uint local_ec;
  byte *local_e8;
  Array<unsigned_long,_4UL> *local_e0;
  uint local_d8;
  uint local_d4;
  byte *local_d0;
  Array<unsigned_long,_4UL> *local_c8;
  byte *local_c0;
  byte *local_b8;
  byte *local_b0;
  byte *local_a8;
  Array<unsigned_long,_4UL> *local_a0;
  uint local_98;
  uint local_94;
  byte *local_90;
  Array<unsigned_long,_4UL> *local_88;
  byte *local_80;
  byte *local_78;
  byte *local_70;
  Array<unsigned_long,_4UL> *local_68;
  uint local_60;
  uint local_5c;
  byte *local_58;
  Array<unsigned_long,_4UL> *local_50;
  byte *local_48;
  byte *local_40;
  Array<unsigned_long,_4UL> *local_38;
  uint local_30;
  uint local_2c;
  byte *local_28;
  Array<unsigned_long,_4UL> *local_20;
  uint local_18;
  uint local_14;
  byte *local_10;
  Array<unsigned_long,_4UL> *local_8;
  
  local_d50 = local_de5;
  if (in_DIL != '\x01' && in_DIL != '\x02') {
    DebugUtils::assertionFailed
              (in_stack_fffffffffffff350,(int)((ulong)in_stack_fffffffffffff348 >> 0x20),
               in_stack_fffffffffffff340);
  }
  local_e0c = *in_RSI;
  local_e10 = in_RSI[1];
  local_de0 = local_e0c;
  if (0x6ba < local_e0c) {
    EVar8 = DebugUtils::errored(0x1a);
    return EVar8;
  }
  local_e08 = in_R8;
  local_e00 = in_RCX;
  local_df8 = in_RDX;
  local_df0 = in_RSI;
  local_e18 = InstDB::infoById(0x1e47ac);
  local_e20 = (AdditionalInfo *)
              (InstDB::_additionalInfoTable + (ulong)(*(uint *)local_e18 >> 0x18) * 8);
  local_e28 = InstDB::AdditionalInfo::featuresBegin(local_e20);
  local_e30 = InstDB::AdditionalInfo::featuresEnd(local_e20);
  local_d40 = local_e08;
  local_9b8 = local_e08;
  local_9c0 = 0;
  Support::Array<unsigned_long,_4UL>::fill(local_e08,&local_9c0);
  do {
    local_e34 = (uint)*local_e28;
    if (local_e34 == 0) break;
    local_d30 = local_e08;
    local_d38 = &local_e34;
    local_938 = local_e08;
    local_940 = local_d38;
    if (0xff < local_e34) {
      DebugUtils::assertionFailed
                (in_stack_fffffffffffff350,(int)((ulong)in_stack_fffffffffffff348 >> 0x20),
                 in_stack_fffffffffffff340);
    }
    local_944 = (uint)(*local_e28 >> 6);
    local_948 = local_e34 & 0x3f;
    sVar13 = (sbyte)local_948;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = 1L << sVar13 | *puVar11;
    local_e28 = local_e28 + 1;
  } while (local_e28 != local_e30);
  pbVar6 = local_e28;
  pbVar10 = InstDB::AdditionalInfo::featuresBegin(local_e20);
  if (pbVar6 == pbVar10) {
    return 0;
  }
  local_e3c = InstInternal_regAnalysis(local_df8,local_e00);
  local_e4f[0x12] = 0x4e;
  local_cc8 = local_e4f + 0x12;
  local_920 = local_e08;
  local_92c = 1;
  local_930 = 0xe;
  local_928 = local_cc8;
  puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  bVar20 = true;
  if ((*puVar11 >> ((byte)local_930 & 0x3f) & 1) == 0) {
    local_e4f[0x11] = 0x4f;
    local_cd0 = local_e08;
    local_cd8 = local_e4f + 0x11;
    local_908 = local_e08;
    local_914 = 1;
    local_918 = 0xf;
    local_910 = local_cd8;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    bVar20 = (*puVar11 >> ((byte)local_918 & 0x3f) & 1) != 0;
  }
  if (bVar20) {
    local_e4f[0x10] = 0x79;
    local_ce0 = local_e08;
    local_ce8 = local_e4f + 0x10;
    local_8f0 = local_e08;
    local_8fc = 1;
    local_900 = 0x39;
    local_8f8 = local_ce8;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    bVar20 = true;
    if ((*puVar11 >> ((byte)local_900 & 0x3f) & 1) == 0) {
      local_e4f[0xf] = 0x7a;
      local_cf0 = local_e08;
      local_cf8 = local_e4f + 0xf;
      local_8d8 = local_e08;
      local_8e4 = 1;
      local_8e8 = 0x3a;
      local_8e0 = local_cf8;
      puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
      bVar20 = (*puVar11 >> ((byte)local_8e8 & 0x3f) & 1) != 0;
    }
    if (bVar20) {
      bVar20 = RegAnalysis::hasRegType(&local_e3c,kARM_VecQ);
      if (bVar20) {
        local_e4f[0xb] = 0x4e;
        local_838 = local_e4f + 0xb;
        local_830 = local_e08;
        local_83c = 1;
        local_840 = 0xe;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = *puVar11 & 0xffffffffffffbfff;
        local_e4f[10] = 0x4f;
        local_820 = local_e4f + 10;
        local_818 = local_e08;
        local_824 = 1;
        local_828 = 0xf;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = *puVar11 & 0xffffffffffff7fff;
      }
      else {
        local_e4f[0xe] = 0x79;
        local_880 = local_e4f + 0xe;
        local_878 = local_e08;
        local_884 = 1;
        local_888 = 0x39;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = *puVar11 & 0xfdffffffffffffff;
        local_e4f[0xd] = 0x7a;
        local_868 = local_e4f + 0xd;
        local_860 = local_e08;
        local_86c = 1;
        local_870 = 0x3a;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = *puVar11 & 0xfbffffffffffffff;
        local_e4f[0xc] = 0x7c;
        local_850 = local_e4f + 0xc;
        local_848 = local_e08;
        local_854 = 1;
        local_858 = 0x3c;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = *puVar11 & 0xefffffffffffffff;
      }
      if (local_e0c == 0x21b) {
        if (local_e00 != 0) {
          local_d80 = local_df8;
          local_d78 = local_df8;
          local_a70 = local_df8;
          local_a18 = local_df8;
          if (((local_df8->_signature)._bits & 7) == 2) {
            local_e4f[9] = 0x7a;
            local_808 = local_e4f + 9;
            local_800 = local_e08;
            local_80c = 1;
            local_810 = 0x3a;
            puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                                (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
            *puVar11 = *puVar11 & 0xfbffffffffffffff;
            goto LAB_001e51fe;
          }
        }
        local_e4f[8] = 0x7c;
        local_7f0 = local_e4f + 8;
        local_7e8 = local_e08;
        local_7f4 = 1;
        local_7f8 = 0x3c;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = *puVar11 & 0xefffffffffffffff;
      }
    }
  }
LAB_001e51fe:
  local_e4f[7] = 0x88;
  local_d00 = local_e08;
  local_d08 = local_e4f + 7;
  local_8c0 = local_e08;
  local_8cc = 2;
  local_8d0 = 8;
  local_8c8 = local_d08;
  puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  if ((*puVar11 >> ((byte)local_8d0 & 0x3f) & 1) != 0) {
    bVar20 = RegAnalysis::hasRegType(&local_e3c,kVec512);
    if ((bVar20) ||
       (bVar20 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                           (local_e10,kX86_Evex), bVar20)) {
      pAVar7 = local_e08;
      local_e4f[6] = 0xe;
      local_e4f[5] = 0x5b;
      local_790 = local_e4f + 6;
      local_798 = local_e4f + 5;
      local_788 = local_e08;
      local_758 = local_e08;
      local_764 = 0;
      local_768 = 0xe;
      local_760 = local_790;
      puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
      *puVar11 = *puVar11 & 0xffffffffffffbfff;
      local_770 = pAVar7;
      local_778 = local_798;
      local_77c = (uint)(*local_798 >> 6);
      local_780 = *local_798 & 0x3f;
      sVar13 = (sbyte)local_780;
      puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
      *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    }
    else {
      bVar20 = RegAnalysis::hasRegType(&local_e3c,kVec256);
      pAVar7 = local_e08;
      if (bVar20) {
        local_e4f[4] = 0x18;
        local_e4f[3] = 0x1e;
        local_748 = local_e4f + 4;
        local_750 = local_e4f + 3;
        local_740 = local_e08;
        local_710 = local_e08;
        local_71c = 0;
        local_720 = 0x18;
        local_718 = local_748;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = *puVar11 & 0xfffffffffeffffff;
        local_728 = pAVar7;
        local_730 = local_750;
        local_734 = (uint)(*local_750 >> 6);
        local_738 = *local_750 & 0x3f;
        sVar13 = (sbyte)local_738;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
      }
      else {
        local_e4f[2] = 0x18;
        local_e4f[1] = 0x1e;
        local_e4f[0] = 0x88;
        local_6f8 = local_e4f + 2;
        local_700 = local_e4f + 1;
        local_708 = local_e4f;
        local_6f0 = local_e08;
        local_6d8 = local_e08;
        local_6e4 = 0;
        local_6e8 = 0x18;
        local_6e0 = local_6f8;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = *puVar11 & 0xfffffffffeffffff;
        local_6c0 = pAVar7;
        local_6c8 = local_700;
        local_6d0 = local_708;
        local_690 = pAVar7;
        local_698 = local_700;
        local_69c = (uint)(*local_700 >> 6);
        local_6a0 = *local_700 & 0x3f;
        sVar13 = (sbyte)local_6a0;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
        local_6a8 = pAVar7;
        local_6b0 = local_6d0;
        local_6b4 = (uint)(*local_6d0 >> 6);
        local_6b8 = *local_6d0 & 0x3f;
        sVar13 = (sbyte)local_6b8;
        puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                            (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
        *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
      }
    }
  }
  local_e50 = 0xe;
  local_d10 = local_e08;
  local_d18 = &local_e50;
  local_8a8 = local_e08;
  local_8b4 = 0;
  local_8b8 = 0xe;
  local_8b0 = local_d18;
  puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  bVar20 = false;
  if ((*puVar11 >> ((byte)local_8b8 & 0x3f) & 1) != 0) {
    local_e51 = 0xf;
    local_d20 = local_e08;
    local_d28 = &local_e51;
    local_890 = local_e08;
    local_89c = 0;
    local_8a0 = 0xf;
    local_898 = local_d28;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    bVar20 = (*puVar11 >> ((byte)local_8a0 & 0x3f) & 1) != 0;
  }
  if (bVar20) {
    local_e52 = true;
    if ((local_e0c == 0x36b) || (local_e0c == 0x36a)) {
      if ((1 < local_e00) &&
         (local_d90 = local_df8 + 1, local_d88 = local_d90, local_a68 = local_d90,
         local_a20 = local_d90, ((local_d90->_signature)._bits & 7) == 2)) {
        local_e52 = false;
      }
    }
    else {
      local_e62[0xf] = 0xd;
      local_bc0 = local_e62 + 0xf;
      local_bc1 = 0xe;
      local_9b0 = &local_bc1;
      local_e52 = ((ulong)local_e3c & 0x6000) != 0;
      local_9a8 = local_bc0;
      local_9a0 = local_bc0;
      local_998 = local_9b0;
    }
    if (local_e52 == false) {
      local_e62[0xd] = 0xf;
      local_7c0 = local_e62 + 0xd;
      local_7b8 = local_e08;
      local_7c4 = 0;
      local_7c8 = 0xf;
      puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
      *puVar11 = *puVar11 & 0xffffffffffff7fff;
    }
    else {
      local_e62[0xe] = 0xe;
      local_7d8 = local_e62 + 0xe;
      local_7d0 = local_e08;
      local_7dc = 0;
      local_7e0 = 0xe;
      puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                          (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
      *puVar11 = *puVar11 & 0xffffffffffffbfff;
    }
  }
  pAVar7 = local_e08;
  local_e62[0xc] = 0xe;
  local_e62[0xb] = 0x22;
  local_e62[10] = 0x23;
  local_e62[9] = 0x24;
  local_e62[8] = 0xf;
  local_e62[7] = 0x38;
  local_e62[6] = 0x39;
  local_b80 = local_e08;
  local_b88 = local_e62 + 0xc;
  local_b90 = local_e62 + 0xb;
  local_b98 = local_e62 + 10;
  local_ba0 = local_e62 + 9;
  local_ba8 = local_e62 + 8;
  local_bb0 = local_e62 + 7;
  local_bb8 = local_e62 + 6;
  local_650 = local_e08;
  local_638 = local_e08;
  local_644 = 0;
  local_648 = 0xe;
  local_688 = local_bb8;
  local_680 = local_bb0;
  local_678 = local_ba8;
  local_670 = local_ba0;
  local_668 = local_b98;
  local_660 = local_b90;
  local_658 = local_b88;
  local_640 = local_b88;
  puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  uVar12 = *puVar11;
  bVar14 = (byte)local_648;
  local_600 = pAVar7;
  local_608 = local_660;
  local_610 = local_668;
  local_618 = local_670;
  local_620 = local_678;
  local_628 = local_680;
  local_630 = local_688;
  local_5e8 = pAVar7;
  local_5f0 = local_660;
  local_5f4 = (uint)(*local_660 >> 6);
  local_5f8 = *local_660 & 0x3f;
  puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  uVar1 = *puVar11;
  bVar15 = (byte)local_5f8;
  local_520 = pAVar7;
  local_528 = local_610;
  local_530 = local_618;
  local_538 = local_620;
  local_540 = local_628;
  local_548 = local_630;
  local_508 = pAVar7;
  local_510 = local_610;
  local_514 = (uint)(*local_610 >> 6);
  local_518 = *local_610 & 0x3f;
  puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  uVar2 = *puVar11;
  bVar16 = (byte)local_518;
  local_4e0 = pAVar7;
  local_4e8 = local_530;
  local_4f0 = local_538;
  local_4f8 = local_540;
  local_500 = local_548;
  local_4c8 = pAVar7;
  local_4d0 = local_530;
  local_4d4 = (uint)(*local_530 >> 6);
  local_4d8 = *local_530 & 0x3f;
  puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  uVar3 = *puVar11;
  bVar17 = (byte)local_4d8;
  local_430 = pAVar7;
  local_438 = local_4f0;
  local_440 = local_4f8;
  local_448 = local_500;
  local_418 = pAVar7;
  local_420 = local_4f0;
  local_424 = (uint)(*local_4f0 >> 6);
  local_428 = *local_4f0 & 0x3f;
  puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  uVar4 = *puVar11;
  bVar18 = (byte)local_428;
  local_400 = pAVar7;
  local_408 = local_440;
  local_410 = local_448;
  local_3e8 = pAVar7;
  local_3f0 = local_440;
  local_3f4 = (uint)(*local_440 >> 6);
  local_3f8 = *local_440 & 0x3f;
  puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  uVar5 = *puVar11;
  bVar19 = (byte)local_3f8;
  local_380 = pAVar7;
  local_388 = local_410;
  local_368 = pAVar7;
  local_370 = local_410;
  local_374 = (uint)(*local_410 >> 6);
  local_378 = *local_410 & 0x3f;
  puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                      (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
  pAVar7 = local_e08;
  bVar20 = false;
  if ((uVar12 >> (bVar14 & 0x3f) & 1) != 0 ||
      ((uVar1 >> (bVar15 & 0x3f) & 1) != 0 ||
      ((uVar2 >> (bVar16 & 0x3f) & 1) != 0 ||
      ((uVar3 >> (bVar17 & 0x3f) & 1) != 0 ||
      ((uVar4 >> (bVar18 & 0x3f) & 1) != 0 ||
      ((uVar5 >> (bVar19 & 0x3f) & 1) != 0 || (*puVar11 >> ((byte)local_378 & 0x3f) & 1) != 0))))))
  {
    local_e62[5] = 0x12;
    local_e62[4] = 0x14;
    local_e62[3] = 0x16;
    local_e62[2] = 0x18;
    local_e62[1] = 0x1a;
    local_e62[0] = 0x1f;
    local_b48 = local_e08;
    local_b50 = local_e62 + 5;
    local_b58 = local_e62 + 4;
    local_b60 = local_e62 + 3;
    local_b68 = local_e62 + 2;
    local_b70 = local_e62 + 1;
    local_b78 = local_e62;
    local_5b0 = local_e08;
    local_598 = local_e08;
    local_5a4 = 0;
    local_5a8 = 0x12;
    local_5e0 = local_b78;
    local_5d8 = local_b70;
    local_5d0 = local_b68;
    local_5c8 = local_b60;
    local_5c0 = local_b58;
    local_5b8 = local_b50;
    local_5a0 = local_b50;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    uVar12 = *puVar11;
    bVar14 = (byte)local_5a8;
    local_568 = pAVar7;
    local_570 = local_5c0;
    local_578 = local_5c8;
    local_580 = local_5d0;
    local_588 = local_5d8;
    local_590 = local_5e0;
    local_550 = pAVar7;
    local_558 = local_5c0;
    local_55c = (uint)(*local_5c0 >> 6);
    local_560 = *local_5c0 & 0x3f;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    uVar1 = *puVar11;
    bVar15 = (byte)local_560;
    local_4a0 = pAVar7;
    local_4a8 = local_578;
    local_4b0 = local_580;
    local_4b8 = local_588;
    local_4c0 = local_590;
    local_488 = pAVar7;
    local_490 = local_578;
    local_494 = (uint)(*local_578 >> 6);
    local_498 = *local_578 & 0x3f;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    uVar2 = *puVar11;
    bVar16 = (byte)local_498;
    local_468 = pAVar7;
    local_470 = local_4b0;
    local_478 = local_4b8;
    local_480 = local_4c0;
    local_450 = pAVar7;
    local_458 = local_4b0;
    local_45c = (uint)(*local_4b0 >> 6);
    local_460 = *local_4b0 & 0x3f;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    uVar3 = *puVar11;
    bVar17 = (byte)local_460;
    local_3d0 = pAVar7;
    local_3d8 = local_478;
    local_3e0 = local_480;
    local_3b8 = pAVar7;
    local_3c0 = local_478;
    local_3c4 = (uint)(*local_478 >> 6);
    local_3c8 = *local_478 & 0x3f;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    uVar4 = *puVar11;
    bVar18 = (byte)local_3c8;
    local_3a8 = pAVar7;
    local_3b0 = local_3e0;
    local_390 = pAVar7;
    local_398 = local_3e0;
    local_39c = (uint)(*local_3e0 >> 6);
    local_3a0 = *local_3e0 & 0x3f;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    bVar20 = (uVar12 >> (bVar14 & 0x3f) & 1) != 0 ||
             ((uVar1 >> (bVar15 & 0x3f) & 1) != 0 ||
             ((uVar2 >> (bVar16 & 0x3f) & 1) != 0 ||
             ((uVar3 >> (bVar17 & 0x3f) & 1) != 0 ||
             ((uVar4 >> (bVar18 & 0x3f) & 1) != 0 || (*puVar11 >> ((byte)local_3a0 & 0x3f) & 1) != 0
             ))));
  }
  if (!bVar20) goto LAB_001e7e46;
  local_b40 = local_df0;
  uVar9 = InstInternal_usesAvx512(local_e10,(RegOnly *)(local_df0 + 2),&local_e3c);
  local_e68 = uVar9 | local_e3c.highVecUsed;
  if (((local_e0c == 0x380) || (local_e0c == 0x382)) || (local_e0c == 0x3a8)) {
    local_fd6 = false;
    if (1 < local_e00) {
      local_b38 = local_df8;
      local_b30 = local_df8;
      local_990 = local_df8;
      local_980 = local_df8;
      local_988[1] = 0x20000169;
      local_978 = local_df8;
      local_958 = local_df8;
      local_95c = 0xff000fff;
      local_988[0] = (local_df8->_signature)._bits & 0xff000fff;
      local_968 = local_988;
      local_96c = 0x20000169;
      local_fd6 = local_988[0] == 0x20000169;
      local_970 = local_988[0];
      local_94c = local_988[0];
    }
    local_e68 = local_fd6 | local_e68;
  }
  else if ((local_e0c - 0x466 < 2) || (local_e0c - 0x470 < 2)) {
LAB_001e6e16:
    local_e68 = local_e00 == 2 | local_e68;
  }
  else if ((local_e0c - 0x4ff < 2) || (local_e0c - 0x503 < 2)) {
    local_fd5 = false;
    if (1 < local_e00) {
      local_d58 = local_df8 + 1;
      local_d60 = (local_d58->_signature)._bits;
      local_a08 = &local_d60;
      local_a0c = 0xf07;
      local_d5c = local_d60 & 0xf07;
      local_9e0 = 1;
      local_9dc = 1;
      local_d68 = 1;
      local_9f5 = 0;
      local_d6c = 0;
      local_9d0 = &local_d68;
      local_9d8 = &local_d6c;
      local_d64 = 1;
      local_a78 = &local_d5c;
      local_a80 = &local_d64;
      local_fd5 = local_d5c == 1;
      local_9fc = local_d5c;
      local_9f4 = local_d6c;
      local_9f0 = local_d58;
      local_9e4 = local_d60;
      local_9c4 = local_d64;
    }
    local_e68 = local_fd5 | local_e68;
  }
  else if (local_e0c == 0x547) {
    local_fd8 = 0;
    if (2 < local_e00) {
      local_dc0 = local_df8 + 2;
      local_fd8 = ((local_dc0->_signature)._bits & 7) == 4 ^ 0xff;
      local_db8 = local_dc0;
      local_a50 = local_dc0;
      local_a38 = local_dc0;
    }
    local_e68 = local_fd8 & 1 | local_e68;
  }
  else if (local_e0c == 0x549) {
    local_fd9 = 0;
    if (2 < local_e00) {
      local_db0 = local_df8 + 1;
      local_fda = 1;
      if (((local_db0->_signature)._bits & 7) != 2) {
        local_dd0 = local_df8 + 2;
        local_fda = ((local_dd0->_signature)._bits & 7) == 4 ^ 0xff;
        local_dc8 = local_dd0;
        local_a48 = local_dd0;
        local_a40 = local_dd0;
      }
      local_fd9 = local_fda;
      local_da8 = local_db0;
      local_a58 = local_db0;
      local_a30 = local_db0;
    }
    local_e68 = local_fd9 & 1 | local_e68;
  }
  else {
    if (local_e0c - 0x559 < 4) goto LAB_001e6e16;
    if (((local_e0c - 0x600 < 3) || (local_e0c - 0x606 < 3)) ||
       ((local_e0c - 0x60c < 4 || (local_e0c == 0x613)))) {
      local_fd7 = false;
      if (1 < local_e00) {
        local_da0 = local_df8 + 1;
        local_fd7 = ((local_da0->_signature)._bits & 7) == 2;
        local_d98 = local_da0;
        local_a60 = local_da0;
        local_a28 = local_da0;
      }
      local_e68 = local_fd7 | local_e68;
    }
  }
  local_b28 = local_e18;
  local_b20 = (uint *)(InstDB::_commonInfoTable + (ulong)(*(uint *)local_e18 >> 0xe & 0x3ff) * 8);
  local_a8c = 0x1000000;
  local_a88 = local_b20;
  bVar20 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::InstFlags>(*local_b20,kPreferEvex)
  ;
  if (bVar20) {
    local_b14 = 0x800;
    local_b18 = 0x400;
    bVar20 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                       (local_e10,kX86_Vex|kX86_Vex3);
    if (!bVar20) {
      local_e68 = 1;
    }
  }
  pAVar7 = local_e08;
  if (local_e68 == 0) {
    local_e76[6] = 0x12;
    local_e76[5] = 0x14;
    local_e76[4] = 0x16;
    local_e76[3] = 0x18;
    local_e76[2] = 0x1a;
    local_e76[1] = 0x1e;
    local_e76[0] = 0x1f;
    local_ad8 = local_e08;
    local_ae0 = local_e76 + 6;
    local_ae8 = local_e76 + 5;
    local_af0 = local_e76 + 4;
    local_af8 = local_e76 + 3;
    local_b00 = local_e76 + 2;
    local_b08 = local_e76 + 1;
    local_b10 = local_e76;
    local_2d0 = local_e08;
    local_2b8 = local_e08;
    local_2c4 = 0;
    local_2c8 = 0x12;
    in_stack_ffffffffffffef50 = (Array<unsigned_long,_4UL> *)0xfffffffffffbffff;
    local_308 = local_b10;
    local_300 = local_b08;
    local_2f8 = local_b00;
    local_2f0 = local_af8;
    local_2e8 = local_af0;
    local_2e0 = local_ae8;
    local_2d8 = local_ae0;
    local_2c0 = local_ae0;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        ((Array<unsigned_long,_4UL> *)0xfffffffffffbffff,in_stack_ffffffffffffef48);
    *puVar11 = (ulong)in_stack_ffffffffffffef50 & *puVar11;
    local_280 = pAVar7;
    local_288 = local_2e0;
    local_290 = local_2e8;
    local_298 = local_2f0;
    local_2a0 = local_2f8;
    local_2a8 = local_300;
    local_2b0 = local_308;
    local_268 = pAVar7;
    local_270 = local_2e0;
    local_274 = (uint)(*local_2e0 >> 6);
    local_278 = *local_2e0 & 0x3f;
    sVar13 = (sbyte)local_278;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    local_1a0 = pAVar7;
    local_1a8 = local_290;
    local_1b0 = local_298;
    local_1b8 = local_2a0;
    local_1c0 = local_2a8;
    local_1c8 = local_2b0;
    local_188 = pAVar7;
    local_190 = local_290;
    local_194 = (uint)(*local_290 >> 6);
    local_198 = *local_290 & 0x3f;
    sVar13 = (sbyte)local_198;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    local_160 = pAVar7;
    local_168 = local_1b0;
    local_170 = local_1b8;
    local_178 = local_1c0;
    local_180 = local_1c8;
    local_148 = pAVar7;
    local_150 = local_1b0;
    local_154 = (uint)(*local_1b0 >> 6);
    local_158 = *local_1b0 & 0x3f;
    sVar13 = (sbyte)local_158;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    local_128 = pAVar7;
    local_130 = local_170;
    local_138 = local_178;
    local_140 = local_180;
    local_110 = pAVar7;
    local_118 = local_170;
    local_11c = (uint)(*local_170 >> 6);
    local_120 = *local_170 & 0x3f;
    sVar13 = (sbyte)local_120;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    local_f8 = pAVar7;
    local_100 = local_138;
    local_108 = local_140;
    local_c8 = pAVar7;
    local_d0 = local_138;
    local_d4 = (uint)(*local_138 >> 6);
    local_d8 = *local_138 & 0x3f;
    sVar13 = (sbyte)local_d8;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    local_e0 = pAVar7;
    local_e8 = local_108;
    local_ec = (uint)(*local_108 >> 6);
    local_f0 = *local_108 & 0x3f;
    sVar13 = (sbyte)local_f0;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
  }
  else {
    local_e76[0xd] = 0xe;
    local_e76[0xc] = 0x22;
    local_e76[0xb] = 0x23;
    local_e76[10] = 0x24;
    local_e76[9] = 0xf;
    local_e76[8] = 0x38;
    local_e76[7] = 0x39;
    local_a98 = local_e08;
    local_aa0 = local_e76 + 0xd;
    local_aa8 = local_e76 + 0xc;
    local_ab0 = local_e76 + 0xb;
    local_ab8 = local_e76 + 10;
    local_ac0 = local_e76 + 9;
    local_ac8 = local_e76 + 8;
    local_ad0 = local_e76 + 7;
    local_328 = local_e08;
    local_310 = local_e08;
    local_31c = 0;
    local_320 = 0xe;
    local_360 = local_ad0;
    local_358 = local_ac8;
    local_350 = local_ac0;
    local_348 = local_ab8;
    local_340 = local_ab0;
    local_338 = local_aa8;
    local_330 = local_aa0;
    local_318 = local_aa0;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = *puVar11 & 0xffffffffffffbfff;
    local_230 = pAVar7;
    local_238 = local_338;
    local_240 = local_340;
    local_248 = local_348;
    local_250 = local_350;
    local_258 = local_358;
    local_260 = local_360;
    local_218 = pAVar7;
    local_220 = local_338;
    local_224 = (uint)(*local_338 >> 6);
    local_228 = *local_338 & 0x3f;
    sVar13 = (sbyte)local_228;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    local_1e8 = pAVar7;
    local_1f0 = local_240;
    local_1f8 = local_248;
    local_200 = local_250;
    local_208 = local_258;
    local_210 = local_260;
    local_1d0 = pAVar7;
    local_1d8 = local_240;
    local_1dc = (uint)(*local_240 >> 6);
    local_1e0 = *local_240 & 0x3f;
    sVar13 = (sbyte)local_1e0;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    local_a0 = pAVar7;
    local_a8 = local_1f8;
    local_b0 = local_200;
    local_b8 = local_208;
    local_c0 = local_210;
    local_88 = pAVar7;
    local_90 = local_1f8;
    local_94 = (uint)(*local_1f8 >> 6);
    local_98 = *local_1f8 & 0x3f;
    sVar13 = (sbyte)local_98;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    local_68 = pAVar7;
    local_70 = local_b0;
    local_78 = local_b8;
    local_80 = local_c0;
    local_50 = pAVar7;
    local_58 = local_b0;
    local_5c = (uint)(*local_b0 >> 6);
    local_60 = *local_b0 & 0x3f;
    sVar13 = (sbyte)local_60;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    local_38 = pAVar7;
    local_40 = local_78;
    local_48 = local_80;
    local_8 = pAVar7;
    local_10 = local_78;
    local_14 = (uint)(*local_78 >> 6);
    local_18 = *local_78 & 0x3f;
    sVar13 = (sbyte)local_18;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
    local_20 = pAVar7;
    local_28 = local_48;
    local_2c = (uint)(*local_48 >> 6);
    local_30 = *local_48 & 0x3f;
    sVar13 = (sbyte)local_30;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,in_stack_ffffffffffffef48);
    *puVar11 = (1L << sVar13 ^ 0xffffffffffffffffU) & *puVar11;
  }
LAB_001e7e46:
  bVar20 = RegAnalysis::hasRegType(&local_e3c,kVec512);
  if (bVar20) {
    local_e77 = 0x1e;
    local_7a8 = &local_e77;
    local_7a0 = local_e08;
    local_7ac = 0;
    local_7b0 = 0x1e;
    uVar12 = 0xffffffffbfffffff;
    puVar11 = Support::Array<unsigned_long,_4UL>::operator[]<unsigned_int>
                        (in_stack_ffffffffffffef50,(uint *)0xffffffffbfffffff);
    *puVar11 = uVar12 & *puVar11;
  }
  return 0;
}

Assistant:

Error queryFeatures(Arch arch, const BaseInst& inst, const Operand_* operands, size_t opCount, CpuFeatures* out) noexcept {
  typedef CpuFeatures::X86 Ext;

  // Only called when `arch` matches X86 family.
  DebugUtils::unused(arch);
  ASMJIT_ASSERT(Environment::isFamilyX86(arch));

  // Get the instruction data.
  InstId instId = inst.id();
  InstOptions options = inst.options();

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(instId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
  const InstDB::AdditionalInfo& additionalInfo = InstDB::_additionalInfoTable[instInfo._additionalInfoIndex];

  const uint8_t* fData = additionalInfo.featuresBegin();
  const uint8_t* fEnd = additionalInfo.featuresEnd();

  // Copy all features to `out`.
  out->reset();
  do {
    uint32_t feature = fData[0];
    if (!feature)
      break;
    out->add(feature);
  } while (++fData != fEnd);

  // Since AsmJit aggregates instructions that share the same name we have to
  // deal with some special cases and also with MMX/SSE and AVX/AVX2 overlaps.
  if (fData != additionalInfo.featuresBegin()) {
    RegAnalysis regAnalysis = InstInternal_regAnalysis(operands, opCount);

    // Handle MMX vs SSE overlap.
    if (out->has(Ext::kMMX) || out->has(Ext::kMMX2)) {
      // Only instructions defined by SSE and SSE2 overlap. Instructions introduced by newer instruction sets like
      // SSE3+ don't state MMX as they require SSE3+.
      if (out->has(Ext::kSSE) || out->has(Ext::kSSE2)) {
        if (!regAnalysis.hasRegType(RegType::kX86_Xmm)) {
          // The instruction doesn't use XMM register(s), thus it's MMX/MMX2 only.
          out->remove(Ext::kSSE);
          out->remove(Ext::kSSE2);
          out->remove(Ext::kSSE4_1);
        }
        else {
          out->remove(Ext::kMMX);
          out->remove(Ext::kMMX2);
        }

        // Special case: PEXTRW instruction is MMX/SSE2 instruction. However, MMX/SSE version cannot access memory
        // (only register to register extract) so when SSE4.1 introduced the whole family of PEXTR/PINSR instructions
        // they also introduced PEXTRW with a new opcode 0x15 that can extract directly to memory. This instruction
        // is, of course, not compatible with MMX/SSE2 and would #UD if SSE4.1 is not supported.
        if (instId == Inst::kIdPextrw) {
          if (opCount >= 1 && operands[0].isMem())
            out->remove(Ext::kSSE2);
          else
            out->remove(Ext::kSSE4_1);
        }
      }
    }

    // Handle PCLMULQDQ vs VPCLMULQDQ.
    if (out->has(Ext::kVPCLMULQDQ)) {
      if (regAnalysis.hasRegType(RegType::kX86_Zmm) || Support::test(options, InstOptions::kX86_Evex)) {
        // AVX512_F & VPCLMULQDQ.
        out->remove(Ext::kAVX, Ext::kPCLMULQDQ);
      }
      else if (regAnalysis.hasRegType(RegType::kX86_Ymm)) {
        out->remove(Ext::kAVX512_F, Ext::kAVX512_VL);
      }
      else {
        // AVX & PCLMULQDQ.
        out->remove(Ext::kAVX512_F, Ext::kAVX512_VL, Ext::kVPCLMULQDQ);
      }
    }

    // Handle AVX vs AVX2 overlap.
    if (out->has(Ext::kAVX) && out->has(Ext::kAVX2)) {
      bool isAVX2 = true;
      // Special case: VBROADCASTSS and VBROADCASTSD were introduced in AVX, but only version that uses memory as a
      // source operand. AVX2 then added support for register source operand.
      if (instId == Inst::kIdVbroadcastss || instId == Inst::kIdVbroadcastsd) {
        if (opCount > 1 && operands[1].isMem())
          isAVX2 = false;
      }
      else {
        // AVX instruction set doesn't support integer operations on YMM registers as these were later introcuced by
        // AVX2. In our case we have to check if YMM register(s) are in use and if that is the case this is an AVX2
        // instruction.
        if (!(regAnalysis.regTypeMask & Support::bitMask(RegType::kX86_Ymm, RegType::kX86_Zmm)))
          isAVX2 = false;
      }

      if (isAVX2)
        out->remove(Ext::kAVX);
      else
        out->remove(Ext::kAVX2);
    }

    // Handle AVX vs AVX512 overlap.
    //
    // In general, non-AVX encoding is preferred, however, AVX encoded instructions that were initially provided
    // as AVX-512 instructions must naturally prefer AVX-512 encoding, as that was the first one provided.
    if (out->hasAny(Ext::kAVX,
                    Ext::kAVX_IFMA,
                    Ext::kAVX_NE_CONVERT,
                    Ext::kAVX_VNNI,
                    Ext::kAVX2,
                    Ext::kF16C,
                    Ext::kFMA)
        &&
        out->hasAny(Ext::kAVX512_BF16,
                    Ext::kAVX512_BW,
                    Ext::kAVX512_DQ,
                    Ext::kAVX512_F,
                    Ext::kAVX512_IFMA,
                    Ext::kAVX512_VNNI)) {

      uint32_t useEvex = InstInternal_usesAvx512(options, inst.extraReg(), regAnalysis) | regAnalysis.highVecUsed;
      switch (instId) {
        // Special case: VPBROADCAST[B|D|Q|W] only supports r32/r64 with EVEX prefix.
        case Inst::kIdVpbroadcastb:
        case Inst::kIdVpbroadcastd:
        case Inst::kIdVpbroadcastq:
        case Inst::kIdVpbroadcastw:
          useEvex |= uint32_t(opCount >= 2 && x86::Reg::isGp(operands[1]));
          break;

        case Inst::kIdVcvtpd2dq:
        case Inst::kIdVcvtpd2ps:
        case Inst::kIdVcvttpd2dq:
          useEvex |= uint32_t(opCount >= 2 && Reg::isYmm(operands[0]));
          break;

        case Inst::kIdVgatherdpd:
        case Inst::kIdVgatherdps:
        case Inst::kIdVgatherqpd:
        case Inst::kIdVgatherqps:
        case Inst::kIdVpgatherdd:
        case Inst::kIdVpgatherdq:
        case Inst::kIdVpgatherqd:
        case Inst::kIdVpgatherqq:
          useEvex |= uint32_t(opCount == 2);
          break;

        // Special case: These instructions only allow `reg, reg. imm` combination in AVX|AVX2 mode, then
        // AVX-512 introduced `reg, reg/mem, imm` combination that uses EVEX prefix. This means that if
        // the second operand is memory then this is AVX-512_BW instruction and not AVX/AVX2 instruction.
        case Inst::kIdVpslldq:
        case Inst::kIdVpslld:
        case Inst::kIdVpsllq:
        case Inst::kIdVpsllw:
        case Inst::kIdVpsrad:
        case Inst::kIdVpsraq:
        case Inst::kIdVpsraw:
        case Inst::kIdVpsrld:
        case Inst::kIdVpsrldq:
        case Inst::kIdVpsrlq:
        case Inst::kIdVpsrlw:
          useEvex |= uint32_t(opCount >= 2 && operands[1].isMem());
          break;

        // Special case: VPERMPD - AVX2 vs AVX512-F case.
        case Inst::kIdVpermpd:
          useEvex |= uint32_t(opCount >= 3 && !operands[2].isImm());
          break;

        // Special case: VPERMQ - AVX2 vs AVX512-F case.
        case Inst::kIdVpermq:
          useEvex |= uint32_t(opCount >= 3 && (operands[1].isMem() || !operands[2].isImm()));
          break;
      }

      if (instInfo.commonInfo().preferEvex() && !Support::test(options, InstOptions::kX86_Vex | InstOptions::kX86_Vex3))
        useEvex = 1;

      if (useEvex) {
        out->remove(Ext::kAVX,
                    Ext::kAVX_IFMA,
                    Ext::kAVX_NE_CONVERT,
                    Ext::kAVX_VNNI,
                    Ext::kAVX2,
                    Ext::kF16C,
                    Ext::kFMA);
      }
      else {
        out->remove(Ext::kAVX512_BF16,
                    Ext::kAVX512_BW,
                    Ext::kAVX512_DQ,
                    Ext::kAVX512_F,
                    Ext::kAVX512_IFMA,
                    Ext::kAVX512_VL,
                    Ext::kAVX512_VNNI);
      }
    }

    // Clear AVX512_VL if ZMM register is used.
    if (regAnalysis.hasRegType(RegType::kX86_Zmm))
      out->remove(Ext::kAVX512_VL);
  }

  return kErrorOk;
}